

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O3

void __thiscall
myvk::SemaphoreGroup::Initialize
          (SemaphoreGroup *this,
          vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
          *semaphores)

{
  pointer ppVVar1;
  pointer psVar2;
  shared_ptr<myvk::Semaphore> *i;
  pointer psVar3;
  VkSemaphore local_28;
  
  ppVVar1 = (this->m_semaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_semaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVVar1) {
    (this->m_semaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVVar1;
  }
  psVar2 = (semaphores->
           super__Vector_base<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (semaphores->
                super__Vector_base<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar2; psVar3 = psVar3 + 1) {
    local_28 = ((psVar3->super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               m_semaphore;
    std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::emplace_back<VkSemaphore_T*>
              ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)this,&local_28);
  }
  return;
}

Assistant:

void SemaphoreGroup::Initialize(const std::vector<Ptr<Semaphore>> &semaphores) {
	m_semaphores.clear();
	for (const auto &i : semaphores)
		m_semaphores.push_back(i->GetHandle());
}